

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::setVerticalSyncEnabled(GlxContext *this,bool enabled)

{
  byte bVar1;
  ostream *poVar2;
  byte in_SIL;
  long in_RDI;
  int result;
  GLXDrawable local_30;
  int local_10;
  
  bVar1 = in_SIL & 1;
  local_10 = 0;
  if (sfglx_ext_EXT_swap_control == 1) {
    if (*(long *)(in_RDI + 0x48) == 0) {
      local_30 = *(GLXDrawable *)(in_RDI + 0x38);
    }
    else {
      local_30 = *(GLXDrawable *)(in_RDI + 0x48);
    }
    (*sf_ptrc_glXSwapIntervalEXT)(*(Display **)(in_RDI + 0x30),local_30,SUB14(bVar1 != 0,0));
  }
  else if (sfglx_ext_MESA_swap_control == 1) {
    local_10 = (*sf_ptrc_glXSwapIntervalMESA)(SUB14(bVar1 != 0,0));
  }
  else if (sfglx_ext_SGI_swap_control == 1) {
    local_10 = (*sf_ptrc_glXSwapIntervalSGI)(SUB14(bVar1 != 0,0));
  }
  else if (!setVerticalSyncEnabled::warned) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Setting vertical sync not supported");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    setVerticalSyncEnabled::warned = true;
  }
  if (local_10 != 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Setting vertical sync failed");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void GlxContext::setVerticalSyncEnabled(bool enabled)
{
    int result = 0;

    // Prioritize the EXT variant and fall back to MESA or SGI if needed
    // We use the direct pointer to the MESA entry point instead of the alias
    // because glx.h declares the entry point as an external function
    // which would require us to link in an additional library
    if (sfglx_ext_EXT_swap_control == sfglx_LOAD_SUCCEEDED)
    {
        glXSwapIntervalEXT(m_display, m_pbuffer ? m_pbuffer : m_window, enabled ? 1 : 0);
    }
    else if (sfglx_ext_MESA_swap_control == sfglx_LOAD_SUCCEEDED)
    {
        result = sf_ptrc_glXSwapIntervalMESA(enabled ? 1 : 0);
    }
    else if (sfglx_ext_SGI_swap_control == sfglx_LOAD_SUCCEEDED)
    {
        result = glXSwapIntervalSGI(enabled ? 1 : 0);
    }
    else
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "Setting vertical sync not supported" << std::endl;

            warned = true;
        }
    }

    if (result != 0)
        err() << "Setting vertical sync failed" << std::endl;
}